

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update2sparse
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int *rn,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *eps2,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *vec2,int *idx2,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int *rn2,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  bool bVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  uint *puVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  uint *puVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar21;
  byte bVar22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  uint local_5ec;
  int *local_5b0;
  cpp_dec_float<200U,_int,_void> local_5a0;
  cpp_dec_float<200U,_int,_void> local_520;
  cpp_dec_float<200U,_int,_void> local_4a0;
  cpp_dec_float<200U,_int,_void> local_420;
  uint local_3a0 [28];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  uint local_130 [28];
  int local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar22 = 0;
  puVar16 = (uint *)eps;
  puVar19 = local_b0;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar19 = *puVar16;
    puVar16 = puVar16 + 1;
    puVar19 = puVar19 + 1;
  }
  local_40 = (eps->m_backend).exp;
  local_3c = (eps->m_backend).neg;
  local_38._0_4_ = (eps->m_backend).fpclass;
  local_38._4_4_ = (eps->m_backend).prec_elem;
  puVar16 = (uint *)eps2;
  puVar19 = local_130;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar19 = *puVar16;
    puVar16 = puVar16 + 1;
    puVar19 = puVar19 + 1;
  }
  local_c0 = (eps2->m_backend).exp;
  local_bc = (eps2->m_backend).neg;
  local_b8._0_4_ = (eps2->m_backend).fpclass;
  local_b8._4_4_ = (eps2->m_backend).prec_elem;
  vSolveLright2(this,rhs,ridx,rn,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_b0,rhs2,ridx2,rn2,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_130);
  piVar4 = (this->row).perm;
  if (forest == (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)0x0) {
    if (*rn < 1) {
      iVar7 = 0;
    }
    else {
      lVar10 = 0;
      uVar13 = 0;
      do {
        uVar12 = (uint)uVar13;
        iVar7 = ridx[lVar10];
        iVar6 = rhs[iVar7].m_backend.exp;
        bVar1 = rhs[iVar7].m_backend.neg;
        pcVar17 = &rhs[iVar7].m_backend;
        pcVar15 = &local_5a0;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pcVar15->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + ((ulong)bVar22 * -2 + 1) * 4)
          ;
        }
        local_5a0.fpclass = rhs[iVar7].m_backend.fpclass;
        local_5a0.prec_elem = rhs[iVar7].m_backend.prec_elem;
        pnVar18 = eps;
        pcVar17 = &local_4a0;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pcVar17->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + ((ulong)bVar22 * -2 + 1) * 4)
          ;
        }
        local_4a0.exp = (eps->m_backend).exp;
        local_4a0.neg = (eps->m_backend).neg;
        local_4a0.fpclass = (eps->m_backend).fpclass;
        local_4a0.prec_elem = (eps->m_backend).prec_elem;
        local_5a0.neg = bVar1;
        if ((bVar1 == true) &&
           (local_5a0.data._M_elems[0] != 0 || local_5a0.fpclass != cpp_dec_float_finite)) {
          local_5a0.neg = false;
        }
        local_5a0.exp = iVar6;
        if ((local_4a0.fpclass == cpp_dec_float_NaN || local_5a0.fpclass == cpp_dec_float_NaN) ||
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_5a0,&local_4a0), iVar6 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                    (&rhs[iVar7].m_backend,0);
        }
        else {
          iVar7 = piVar4[iVar7];
          uVar8 = uVar12;
          if (0 < (int)uVar12) {
            do {
              uVar14 = (uint)uVar13 - 1;
              uVar9 = uVar14 >> 1;
              uVar8 = (uint)uVar13;
              if (iVar7 <= ridx[uVar9]) break;
              ridx[uVar13] = ridx[uVar9];
              uVar13 = (ulong)uVar9;
              uVar8 = uVar9;
            } while (1 < uVar14);
          }
          uVar13 = (ulong)(uVar12 + 1);
          ridx[(int)uVar8] = iVar7;
        }
        iVar7 = (int)uVar13;
        lVar10 = lVar10 + 1;
      } while (lVar10 < *rn);
    }
    *rn = iVar7;
  }
  else {
    if (*rn < 1) {
      local_5ec = 0;
    }
    else {
      local_5b0 = forestIdx;
      lVar10 = 0;
      local_5ec = 0;
      do {
        iVar7 = ridx[lVar10];
        pcVar17 = &rhs[iVar7].m_backend;
        pcVar15 = pcVar17;
        puVar16 = local_3a0;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          *puVar16 = (pcVar15->data)._M_elems[0];
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar22 * -8 + 4);
          puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
        }
        iVar6 = rhs[iVar7].m_backend.exp;
        bVar1 = rhs[iVar7].m_backend.neg;
        fVar2 = rhs[iVar7].m_backend.fpclass;
        iVar3 = rhs[iVar7].m_backend.prec_elem;
        pcVar15 = pcVar17;
        pcVar20 = &local_5a0;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pcVar20->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar22 * -8 + 4);
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + ((ulong)bVar22 * -2 + 1) * 4)
          ;
        }
        pnVar18 = eps;
        pcVar15 = &local_420;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pcVar15->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + ((ulong)bVar22 * -2 + 1) * 4)
          ;
        }
        local_420.exp = (eps->m_backend).exp;
        local_420.neg = (eps->m_backend).neg;
        local_420.fpclass = (eps->m_backend).fpclass;
        local_420.prec_elem = (eps->m_backend).prec_elem;
        local_5a0.prec_elem = iVar3;
        local_5a0.fpclass = fVar2;
        local_5a0.neg = bVar1;
        if ((bVar1 == true) && (local_5a0.data._M_elems[0] != 0 || fVar2 != cpp_dec_float_finite)) {
          local_5a0.neg = false;
        }
        local_5a0.exp = iVar6;
        if ((local_420.fpclass == cpp_dec_float_NaN || fVar2 == cpp_dec_float_NaN) ||
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_5a0,&local_420), iVar5 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar17,0);
        }
        else {
          *local_5b0 = iVar7;
          iVar5 = piVar4[iVar7];
          uVar12 = local_5ec;
          if (0 < (int)local_5ec) {
            do {
              uVar8 = uVar12 - 1;
              uVar9 = uVar8 >> 1;
              if (iVar5 <= ridx[uVar9]) break;
              ridx[uVar12] = ridx[uVar9];
              uVar12 = uVar9;
            } while (1 < uVar8);
          }
          local_5b0 = local_5b0 + 1;
          local_5ec = local_5ec + 1;
          ridx[(int)uVar12] = iVar5;
          puVar16 = local_3a0;
          pnVar18 = forest + iVar7;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pnVar18->m_backend).data._M_elems[0] = *puVar16;
            puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
            pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
          }
          forest[iVar7].m_backend.exp = iVar6;
          forest[iVar7].m_backend.neg = bVar1;
          forest[iVar7].m_backend.fpclass = fVar2;
          forest[iVar7].m_backend.prec_elem = iVar3;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < *rn);
    }
    *rn = local_5ec;
    *forestNum = local_5ec;
  }
  if (*rn2 < 1) {
    iVar7 = 0;
  }
  else {
    lVar10 = 0;
    uVar13 = 0;
    do {
      uVar12 = (uint)uVar13;
      iVar7 = ridx2[lVar10];
      iVar6 = rhs2[iVar7].m_backend.exp;
      bVar1 = rhs2[iVar7].m_backend.neg;
      pcVar17 = &rhs2[iVar7].m_backend;
      pcVar15 = &local_5a0;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pcVar15->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      local_5a0.fpclass = rhs2[iVar7].m_backend.fpclass;
      local_5a0.prec_elem = rhs2[iVar7].m_backend.prec_elem;
      pnVar18 = eps2;
      pcVar17 = &local_520;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pcVar17->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      local_520.exp = (eps2->m_backend).exp;
      local_520.neg = (eps2->m_backend).neg;
      local_520.fpclass = (eps2->m_backend).fpclass;
      local_520.prec_elem = (eps2->m_backend).prec_elem;
      local_5a0.neg = bVar1;
      if ((bVar1 == true) &&
         (local_5a0.data._M_elems[0] != 0 || local_5a0.fpclass != cpp_dec_float_finite)) {
        local_5a0.neg = false;
      }
      local_5a0.exp = iVar6;
      if ((local_520.fpclass == cpp_dec_float_NaN || local_5a0.fpclass == cpp_dec_float_NaN) ||
         (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_5a0,&local_520), iVar6 < 1)) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (&rhs2[iVar7].m_backend,0);
      }
      else {
        iVar7 = piVar4[iVar7];
        uVar8 = uVar12;
        if (0 < (int)uVar12) {
          do {
            uVar14 = (uint)uVar13 - 1;
            uVar9 = uVar14 >> 1;
            uVar8 = (uint)uVar13;
            if (iVar7 <= ridx2[uVar9]) break;
            ridx2[uVar13] = ridx2[uVar9];
            uVar13 = (ulong)uVar9;
            uVar8 = uVar9;
          } while (1 < uVar14);
        }
        uVar13 = (ulong)(uVar12 + 1);
        ridx2[(int)uVar8] = iVar7;
      }
      iVar7 = (int)uVar13;
      lVar10 = lVar10 + 1;
    } while (lVar10 < *rn2);
  }
  *rn2 = iVar7;
  iVar7 = *rn;
  pnVar18 = eps;
  pnVar21 = &local_1b0;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pnVar21->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
    pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
    pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar21 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  local_1b0.m_backend.exp = (eps->m_backend).exp;
  local_1b0.m_backend.neg = (eps->m_backend).neg;
  local_1b0.m_backend.fpclass = (eps->m_backend).fpclass;
  local_1b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
  iVar7 = vSolveUright(this,vec,idx,rhs,ridx,iVar7,&local_1b0);
  *rn = iVar7;
  iVar7 = *rn2;
  pnVar18 = eps2;
  pnVar21 = &local_230;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pnVar21->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
    pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
    pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar21 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  local_230.m_backend.exp = (eps2->m_backend).exp;
  local_230.m_backend.neg = (eps2->m_backend).neg;
  local_230.m_backend.fpclass = (eps2->m_backend).fpclass;
  local_230.m_backend.prec_elem = (eps2->m_backend).prec_elem;
  iVar7 = vSolveUright(this,vec2,idx2,rhs2,ridx2,iVar7,&local_230);
  *rn2 = iVar7;
  if ((this->l).updateType == 0) {
    iVar7 = *rn;
    pnVar18 = eps;
    pnVar21 = &local_2b0;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar21->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar21 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_2b0.m_backend.exp = (eps->m_backend).exp;
    local_2b0.m_backend.neg = (eps->m_backend).neg;
    local_2b0.m_backend.fpclass = (eps->m_backend).fpclass;
    local_2b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
    iVar7 = vSolveUpdateRight(this,vec,idx,iVar7,&local_2b0);
    *rn = iVar7;
    iVar7 = *rn2;
    pnVar18 = eps2;
    pnVar21 = &local_330;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar21->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar21 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_330.m_backend.exp = (eps2->m_backend).exp;
    local_330.m_backend.neg = (eps2->m_backend).neg;
    local_330.m_backend.fpclass = (eps2->m_backend).fpclass;
    local_330.m_backend.prec_elem = (eps2->m_backend).prec_elem;
    iVar7 = vSolveUpdateRight(this,vec2,idx2,iVar7,&local_330);
    *rn2 = iVar7;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update2sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R* forest, int* forestNum, int* forestIdx)
{
   /* solve with L */
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap for both ridx and ridx2 */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   /* solve with U */
   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
   }
}